

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_alter_table.cpp
# Opt level: O3

unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true> __thiscall
duckdb::Transformer::TransformAlter(Transformer *this,PGAlterTableStmt *stmt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PGAlterTableType PVar2;
  PGNode *pPVar3;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var4;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> oVar5;
  bool bVar6;
  AlterStatement *this_00;
  pointer pAVar7;
  reference pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ColumnRefExpression *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  LogicalType *pLVar11;
  InternalException *pIVar12;
  NotImplementedException *pNVar13;
  ParserException *pPVar14;
  __node_base_ptr in_RDX;
  PGListCell *pPVar15;
  undefined8 uVar16;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var17;
  Transformer *this_02;
  optional_ptr<duckdb_libpgquery::PGNode,_true> this_03;
  undefined8 uVar18;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> oVar19;
  _Hash_node_base *p_Var20;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> command;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> column_def;
  templated_unique_single_t *result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names_1;
  optional_ptr<duckdb_libpgquery::PGList,_true> column_name_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  ColumnDefinition column_entry;
  AlterEntryData data;
  QualifiedName qualified_name;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> local_2b0;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> local_2a8;
  __uniq_ptr_impl<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_> local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [24];
  LogicalType local_270;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_258;
  __node_base_ptr local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  LogicalType local_228 [2];
  pointer local_1f0;
  Value local_1e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_1a8 [64];
  size_t *local_168;
  _Prime_rehash_policy local_160;
  __node_base_ptr p_Stack_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_148;
  undefined1 local_140 [8];
  Transformer *local_138;
  __buckets_ptr local_130;
  undefined1 local_128 [24];
  pointer local_110;
  _Hash_node_base local_108;
  __node_base _Stack_100;
  size_t *local_f8;
  _Prime_rehash_policy local_f0;
  __node_base_ptr p_Stack_e0;
  __node_base local_d8;
  __buckets_ptr local_d0;
  undefined1 local_c8 [24];
  _Hash_node_base *local_b0;
  pointer local_a8;
  _Hash_node_base local_a0;
  _Hash_node_base *p_Stack_98;
  QualifiedName local_90;
  
  local_2a0._M_t.
  super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>.
  super__Head_base<0UL,_duckdb::AlterStatement_*,_false>._M_head_impl =
       (tuple<duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>)
       (tuple<duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>)this;
  local_258.ptr = (PGNode *)stmt;
  if (*(int *)((long)&(in_RDX[2]._M_nxt)->_M_nxt + 4) != 1) {
    pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
    local_248._M_allocated_capacity = (size_type)&local_238;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Only one ALTER command per statement is supported","");
    ParserException::ParserException(pPVar14,(string *)&local_248);
    __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = (AlterStatement *)operator_new(0x80);
  AlterStatement::AlterStatement(this_00);
  ((SQLStatement *)
  local_2a0._M_t.
  super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>.
  super__Head_base<0UL,_duckdb::AlterStatement_*,_false>._M_head_impl)->_vptr_SQLStatement =
       (_func_int **)this_00;
  TransformQualifiedName(&local_90,(Transformer *)local_258.ptr,(PGRangeVar *)in_RDX[1]._M_nxt);
  p_Var20 = in_RDX[2]._M_nxt[1]._M_nxt;
  if (p_Var20 != (_Hash_node_base *)0x0) {
    local_148 = a_Stack_1a8;
    local_250 = in_RDX;
    do {
      local_2b0.ptr = (PGAlterTableCmd *)p_Var20->_M_nxt;
      local_b0 = &local_a0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_90.catalog._M_dataplus._M_p,
                 (long)&(((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                           *)local_90.catalog._M_string_length)->_M_t).
                        super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                        .super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>.
                        _M_head_impl + local_90.catalog._M_dataplus._M_p);
      local_168 = &local_160._M_next_resize;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,local_90.schema._M_dataplus._M_p,
                 local_90.schema._M_dataplus._M_p + local_90.schema._M_string_length);
      local_138 = (Transformer *)local_128;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_90.name._M_dataplus._M_p,
                 local_90.name._M_dataplus._M_p + local_90.name._M_string_length);
      local_c8[0x10] = *(undefined1 *)((long)&local_250[3]._M_nxt + 4);
      local_128._16_8_ = &local_108;
      local_f8 = &local_f0._M_next_resize;
      if (local_b0 == &local_a0) {
        _Stack_100._M_nxt = p_Stack_98;
      }
      else {
        local_128._16_8_ = local_b0;
      }
      local_108._M_nxt._1_7_ = local_a0._M_nxt._1_7_;
      local_108._M_nxt._0_1_ = local_a0._M_nxt._0_1_;
      local_110 = local_a8;
      local_a8 = (pointer)0x0;
      local_a0._M_nxt._0_1_ = 0;
      if (local_168 == &local_160._M_next_resize) {
        p_Stack_e0 = p_Stack_150;
      }
      else {
        local_f8 = local_168;
      }
      local_f0._M_next_resize =
           CONCAT71(local_160._M_next_resize._1_7_,(undefined1)local_160._M_next_resize);
      local_f0._M_max_load_factor = local_160._M_max_load_factor;
      local_f0._4_4_ = local_160._4_4_;
      local_160._M_max_load_factor = 0.0;
      local_160._4_4_ = 0;
      local_160._M_next_resize._0_1_ = 0;
      this_02 = (Transformer *)local_c8;
      if (local_138 == (Transformer *)local_128) {
        local_c8._8_8_ = local_128._8_8_;
        local_d8._M_nxt = (_Hash_node_base *)this_02;
      }
      else {
        local_d8._M_nxt = (_Hash_node_base *)local_138;
      }
      local_c8._1_7_ = local_128._1_7_;
      local_c8[0] = local_128[0];
      local_d0 = local_130;
      local_130 = (__buckets_ptr)0x0;
      local_128[0] = 0;
      local_168 = &local_160._M_next_resize;
      local_138 = (Transformer *)local_128;
      local_b0 = &local_a0;
      optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
      PVar2 = (local_2b0.ptr)->subtype;
      if (0x18 < (int)PVar2) {
        if (PVar2 != PG_AT_AlterColumnType) {
          if (PVar2 == PG_AT_SetPartitionedBy) {
            local_248._M_allocated_capacity = 0;
            local_248._8_8_ = (__buckets_ptr)0x0;
            local_238._M_allocated_capacity = 0;
            optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
            if ((local_2b0.ptr)->def_list != (PGList *)0x0) {
              optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
              TransformExpressionList
                        ((Transformer *)local_258.ptr,(local_2b0.ptr)->def_list,
                         (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          *)&local_248);
            }
            make_uniq<duckdb::SetPartitionedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                      ((duckdb *)local_298,(AlterEntryData *)(local_128 + 0x10),
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)&local_248);
            uVar16 = local_298._0_8_;
            local_298._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                     ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                   *)local_2a0._M_t.
                                     super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                     .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                     _M_head_impl);
            _Var17._M_head_impl =
                 (pAVar7->info).
                 super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
                 super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>
                 .super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
            (pAVar7->info).
            super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
            super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
            super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
            if (_Var17._M_head_impl != (AlterInfo *)0x0) {
              (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_298._0_8_ + 8))();
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)&local_248);
          }
          else {
            if (PVar2 != PG_AT_SetSortedBy) goto switchD_00e80b79_caseD_1;
            local_248._M_allocated_capacity = 0;
            local_248._8_8_ = (__buckets_ptr)0x0;
            local_238._M_allocated_capacity = 0;
            optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
            if ((local_2b0.ptr)->def_list != (PGList *)0x0) {
              optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
              TransformOrderBy((Transformer *)local_258.ptr,(local_2b0.ptr)->def_list,
                               (vector<duckdb::OrderByNode,_true> *)&local_248);
            }
            make_uniq<duckdb::SetSortedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::OrderByNode,true>>
                      ((duckdb *)local_298,(AlterEntryData *)(local_128 + 0x10),
                       (vector<duckdb::OrderByNode,_true> *)&local_248);
            uVar16 = local_298._0_8_;
            local_298._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                     ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                   *)local_2a0._M_t.
                                     super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                     .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                     _M_head_impl);
            _Var17._M_head_impl =
                 (pAVar7->info).
                 super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
                 super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>
                 .super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
            (pAVar7->info).
            super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
            super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
            super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
            if (_Var17._M_head_impl != (AlterInfo *)0x0) {
              (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_298._0_8_ + 8))();
            }
            ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
                      ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                       &local_248);
          }
          goto LAB_00e814f6;
        }
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        local_288._16_8_ = (local_2b0.ptr)->def;
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)(local_288 + 0x10));
        TransformColumnDefinition
                  ((ColumnDefinition *)&local_248,(Transformer *)local_258.ptr,
                   (PGColumnDef *)local_288._16_8_);
        local_2a8.ptr = (PGColumnDef *)0x0;
        if (*(int *)&local_250[3]._M_nxt != 0x26) {
          pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
          local_298._0_8_ = local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Alter column\'s type is only supported for tables","");
          ParserException::ParserException(pPVar14,(string *)local_298);
          __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ColumnDefinition::GetType((LogicalType *)local_298,(ColumnDefinition *)&local_248);
        LogicalType::LogicalType(&local_270,UNKNOWN);
        bVar6 = LogicalType::operator==((LogicalType *)local_298,&local_270);
        if (bVar6) {
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)(local_288 + 0x10));
          pPVar3 = *(PGNode **)(local_288._16_8_ + 0x28);
          LogicalType::~LogicalType(&local_270);
          LogicalType::~LogicalType((LogicalType *)local_298);
          if (pPVar3 == (PGNode *)0x0) {
            pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
            local_298._0_8_ = local_298 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,
                       "Omitting the type is only possible in combination with USING","");
            ParserException::ParserException(pPVar14,(string *)local_298);
            __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          LogicalType::~LogicalType(&local_270);
          LogicalType::~LogicalType((LogicalType *)local_298);
        }
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)(local_288 + 0x10));
        if (*(PGNode **)(local_288._16_8_ + 0x28) == (PGNode *)0x0) {
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
          oVar5.ptr = local_2b0.ptr;
          this_01 = (ColumnRefExpression *)operator_new(0x50);
          ::std::__cxx11::string::string
                    ((string *)local_298,(oVar5.ptr)->name,(allocator *)&local_270);
          ColumnRefExpression::ColumnRefExpression(this_01,(string *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_);
          }
          pLVar11 = ColumnDefinition::Type((ColumnDefinition *)&local_248);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x60);
          LogicalType::LogicalType((LogicalType *)local_298,pLVar11);
          local_270._0_8_ = this_01;
          CastExpression::CastExpression
                    ((CastExpression *)paVar10,(LogicalType *)local_298,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_270,false);
          if ((ColumnRefExpression *)local_270._0_8_ != (ColumnRefExpression *)0x0) {
            (*(((ParsedExpression *)local_270._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                      ();
          }
          local_270._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          LogicalType::~LogicalType((LogicalType *)local_298);
          oVar19.ptr = local_2a8.ptr;
          local_2a8.ptr = (PGColumnDef *)paVar10;
LAB_00e8140b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)oVar19.ptr !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)oVar19.ptr + 8))();
          }
        }
        else {
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)(local_288 + 0x10));
          TransformExpression((Transformer *)local_298,local_258);
          uVar16 = local_298._0_8_;
          oVar19.ptr = local_2a8.ptr;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2a8.ptr = (PGColumnDef *)uVar16;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)oVar19.ptr !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)oVar19.ptr + 8))();
            oVar19.ptr = (PGColumnDef *)local_298._0_8_;
            goto LAB_00e8140b;
          }
        }
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        oVar5.ptr = local_2b0.ptr;
        pLVar11 = ColumnDefinition::Type((ColumnDefinition *)&local_248);
        make_uniq<duckdb::ChangeColumnTypeInfo,duckdb::AlterEntryData,char*&,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((duckdb *)local_298,(AlterEntryData *)(local_128 + 0x10),&(oVar5.ptr)->name,
                   pLVar11,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&local_2a8);
        uVar16 = local_298._0_8_;
        local_298._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)local_2a0._M_t.
                                 super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                 .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                 _M_head_impl);
        _Var17._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
        if (_Var17._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_298._0_8_ + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.ptr !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_2a8.ptr + 8))();
        }
LAB_00e81499:
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_148);
        Value::~Value(&local_1e8);
        if (local_1f0 != (pointer)0x0) {
          (*(code *)((*local_1f0)->map).map.
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)();
        }
        local_1f0 = (pointer)0x0;
        LogicalType::~LogicalType(local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_allocated_capacity != &local_238) {
          operator_delete((void *)local_248._M_allocated_capacity);
        }
        goto LAB_00e814f6;
      }
      switch(PVar2) {
      case PG_AT_AddColumn:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        local_288._16_8_ = (local_2b0.ptr)->def_list->head->data;
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        local_2a8.ptr = (PGColumnDef *)((local_2b0.ptr)->def_list->tail->data).ptr_value;
        if (*(int *)&local_250[3]._M_nxt != 0x26) {
          pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
          local_248._M_allocated_capacity = (size_type)&local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"Adding columns is only supported for tables","");
          ParserException::ParserException(pPVar14,(string *)&local_248);
          __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a8);
        if ((local_2a8.ptr)->category == COL_GENERATED) {
          pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
          local_248._M_allocated_capacity = (size_type)&local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,
                     "Adding generated columns after table creation is not supported yet","");
          ParserException::ParserException(pPVar14,(string *)&local_248);
          __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a8);
        this_03.ptr = (PGNode *)local_258;
        TransformColumnDefinition
                  ((ColumnDefinition *)&local_248,(Transformer *)local_258.ptr,local_2a8.ptr);
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a8);
        if ((local_2a8.ptr)->constraints != (PGList *)0x0) {
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a8);
          for (pPVar15 = (local_2a8.ptr)->constraints->head; pPVar15 != (PGListCell *)0x0;
              pPVar15 = pPVar15->next) {
            local_270._0_8_ = (pPVar15->data).ptr_value;
            optional_ptr<duckdb_libpgquery::PGConstraint,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGConstraint,_true> *)&local_270);
            this_03.ptr = (PGNode *)local_258;
            TransformConstraint((Transformer *)local_140,(PGConstraint *)local_258.ptr,
                                (ColumnDefinition *)local_270._0_8_,(idx_t)&local_248);
            if (local_140 != (undefined1  [8])0x0) {
              pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
              local_298._0_8_ = local_298 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,"Adding columns with constraints not yet supported","")
              ;
              ParserException::ParserException(pPVar14,(string *)local_298);
              __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
        optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGList,_true> *)(local_288 + 0x10));
        TransformNameList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_270,(Transformer *)this_03.ptr,(PGList *)local_288._16_8_);
        if ((element_type *)local_270._0_8_ ==
            local_270.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
          local_298._0_8_ = local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Expected a name","");
          InternalException::InternalException(pIVar12,(string *)local_298);
          __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)&local_270);
        ColumnDefinition::SetName((ColumnDefinition *)&local_248,pvVar8);
        if ((long)local_270.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
            local_270._0_8_ == 0x20) {
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
          make_uniq<duckdb::AddColumnInfo,duckdb::AlterEntryData,duckdb::ColumnDefinition,bool&>
                    ((duckdb *)local_298,(AlterEntryData *)(local_128 + 0x10),
                     (ColumnDefinition *)&local_248,&(local_2b0.ptr)->missing_ok);
          _Var17._M_head_impl = (AlterInfo *)local_298._0_8_;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                   ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                 *)local_2a0._M_t.
                                   super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                   .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                   _M_head_impl);
        }
        else {
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_270.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + -0x20);
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)local_270.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + -0x20);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)local_270.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + -0x10);
          local_270.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)paVar10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)paVar1->_M_allocated_capacity != paVar9) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)paVar1->_M_allocated_capacity);
          }
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
          make_uniq<duckdb::AddFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,duckdb::ColumnDefinition,bool&>
                    ((duckdb *)local_298,(AlterEntryData *)(local_128 + 0x10),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_270,(ColumnDefinition *)&local_248,&(local_2b0.ptr)->missing_ok);
          _Var17._M_head_impl = (AlterInfo *)local_298._0_8_;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                   ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                 *)local_2a0._M_t.
                                   super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                   .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                   _M_head_impl);
        }
        _Var4._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var17._M_head_impl;
        if (_Var4._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_298._0_8_ + 8))();
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_270);
        goto LAB_00e81499;
      default:
switchD_00e80b79_caseD_1:
        pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_248._M_allocated_capacity = (size_type)&local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"No support for that ALTER TABLE option yet!","");
        NotImplementedException::NotImplementedException(pNVar13,(string *)&local_248);
        __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      case PG_AT_ColumnDefault:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        TransformExpression((Transformer *)local_298,local_258);
        if (*(int *)&local_250[3]._M_nxt != 0x26) {
          pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
          local_248._M_allocated_capacity = (size_type)&local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"Alter column\'s default is only supported for tables","")
          ;
          ParserException::ParserException(pPVar14,(string *)&local_248);
          __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        make_uniq<duckdb::SetDefaultInfo,duckdb::AlterEntryData,char*&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((duckdb *)local_248._M_local_buf,(AlterEntryData *)(local_128 + 0x10),
                   &(local_2b0.ptr)->name,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_298);
        uVar16 = local_248._M_allocated_capacity;
        local_248._M_allocated_capacity = 0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)local_2a0._M_t.
                                 super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                 .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                 _M_head_impl);
        _Var17._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
        uVar16 = local_248._M_allocated_capacity;
        if (_Var17._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
          uVar16 = local_248._M_allocated_capacity;
        }
        break;
      case PG_AT_DropNotNull:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        make_uniq<duckdb::DropNotNullInfo,duckdb::AlterEntryData,char*&>
                  ((duckdb *)local_248._M_local_buf,(AlterEntryData *)(local_128 + 0x10),
                   &(local_2b0.ptr)->name);
        uVar16 = local_248._M_allocated_capacity;
        local_248._M_allocated_capacity = 0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)local_2a0._M_t.
                                 super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                 .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                 _M_head_impl);
        goto LAB_00e80f08;
      case PG_AT_SetNotNull:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        make_uniq<duckdb::SetNotNullInfo,duckdb::AlterEntryData,char*&>
                  ((duckdb *)local_248._M_local_buf,(AlterEntryData *)(local_128 + 0x10),
                   &(local_2b0.ptr)->name);
        uVar16 = local_248._M_allocated_capacity;
        local_248._M_allocated_capacity = 0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)local_2a0._M_t.
                                 super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                 .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                 _M_head_impl);
LAB_00e80f08:
        _Var17._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
        uVar18 = local_248._M_allocated_capacity;
        if (_Var17._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
          uVar18 = local_248._M_allocated_capacity;
        }
        goto LAB_00e80fbc;
      case PG_AT_DropColumn:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        local_270.id_ = (local_2b0.ptr)->behavior == PG_DROP_CASCADE;
        if (*(int *)&local_250[3]._M_nxt != 0x26) {
          pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
          local_248._M_allocated_capacity = (size_type)&local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"Dropping columns is only supported for tables","");
          ParserException::ParserException(pPVar14,(string *)&local_248);
          __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        TransformNameList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_298,this_02,(local_2b0.ptr)->def_list);
        if (local_298._0_8_ == local_298._8_8_) {
          pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
          local_248._M_allocated_capacity = (size_type)&local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"Expected a name","");
          InternalException::InternalException(pIVar12,(string *)&local_248);
          __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_298._8_8_ - local_298._0_8_ == 0x20) {
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)local_298,0);
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
          make_uniq<duckdb::RemoveColumnInfo,duckdb::AlterEntryData,std::__cxx11::string&,bool&,bool&>
                    ((duckdb *)local_248._M_local_buf,(AlterEntryData *)(local_128 + 0x10),pvVar8,
                     &(local_2b0.ptr)->missing_ok,(bool *)&local_270);
          uVar16 = local_248._M_allocated_capacity;
          local_248._M_allocated_capacity = 0;
          pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                   ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                 *)local_2a0._M_t.
                                   super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                   .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                   _M_head_impl);
        }
        else {
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
          make_uniq<duckdb::RemoveFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,bool&,bool&>
                    ((duckdb *)local_248._M_local_buf,(AlterEntryData *)(local_128 + 0x10),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)local_298,&(local_2b0.ptr)->missing_ok,(bool *)&local_270);
          uVar16 = local_248._M_allocated_capacity;
          local_248._M_allocated_capacity = 0;
          pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                   ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                 *)local_2a0._M_t.
                                   super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                   .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                   _M_head_impl);
        }
        _Var17._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
        if (_Var17._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*local_248._M_allocated_capacity + 8))();
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_298);
        goto LAB_00e814f6;
      case PG_AT_AddConstraint:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2b0);
        switchD_012b9b0d::default(&local_248,(local_2b0.ptr)->def,0xa8);
        if (local_248._M_allocated_capacity._4_4_ != 5) {
          pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_298._0_8_ = local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"No support for that ALTER TABLE option yet!","");
          NotImplementedException::NotImplementedException(pNVar13,(string *)local_298);
          __cxa_throw(pNVar13,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        TransformConstraint((Transformer *)local_298,(PGConstraint *)local_258.ptr);
        make_uniq<duckdb::AddConstraintInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  ((duckdb *)&local_270,(AlterEntryData *)(local_128 + 0x10),
                   (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_298);
        uVar16 = local_270._0_8_;
        local_270._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)local_2a0._M_t.
                                 super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
                                 .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>.
                                 _M_head_impl);
        _Var17._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar16;
        uVar16 = local_270._0_8_;
        if (_Var17._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var17._M_head_impl)->super_ParseInfo + 8))();
          uVar16 = local_270._0_8_;
        }
      }
      uVar18 = local_298._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)uVar16 + 8))();
        uVar18 = local_298._0_8_;
      }
LAB_00e80fbc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar18 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)uVar18 + 8))();
      }
LAB_00e814f6:
      if ((Transformer *)local_d8._M_nxt != (Transformer *)local_c8) {
        operator_delete(local_d8._M_nxt);
      }
      if (local_f8 != &local_f0._M_next_resize) {
        operator_delete(local_f8);
      }
      if ((_Hash_node_base *)local_128._16_8_ != &local_108) {
        operator_delete((void *)local_128._16_8_);
      }
      p_Var20 = p_Var20[1]._M_nxt;
    } while (p_Var20 != (_Hash_node_base *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
    operator_delete(local_90.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
    operator_delete(local_90.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)
         (_Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>)
         local_2a0._M_t.
         super__Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>
         .super__Head_base<0UL,_duckdb::AlterStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<AlterStatement> Transformer::TransformAlter(duckdb_libpgquery::PGAlterTableStmt &stmt) {

	D_ASSERT(stmt.relation);
	if (stmt.cmds->length != 1) {
		throw ParserException("Only one ALTER command per statement is supported");
	}

	auto result = make_uniq<AlterStatement>();
	auto qualified_name = TransformQualifiedName(*stmt.relation);

	// Check the ALTER type.
	for (auto c = stmt.cmds->head; c != nullptr; c = c->next) {

		auto command = PGPointerCast<duckdb_libpgquery::PGAlterTableCmd>(c->data.ptr_value);
		AlterEntryData data(qualified_name.catalog, qualified_name.schema, qualified_name.name,
		                    TransformOnEntryNotFound(stmt.missing_ok));

		switch (command->subtype) {
		case duckdb_libpgquery::PG_AT_AddColumn: {
			auto column_name_list = PGPointerCast<duckdb_libpgquery::PGList>(command->def_list->head->data.ptr_value);
			auto column_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(command->def_list->tail->data.ptr_value);
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Adding columns is only supported for tables");
			}
			if (column_def->category == duckdb_libpgquery::COL_GENERATED) {
				throw ParserException("Adding generated columns after table creation is not supported yet");
			}
			auto column_entry = TransformColumnDefinition(*column_def);
			if (column_def->constraints) {
				for (auto cell = column_def->constraints->head; cell != nullptr; cell = cell->next) {
					auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(cell->data.ptr_value);
					auto constraint = TransformConstraint(*pg_constraint, column_entry, 0);
					if (!constraint) {
						continue;
					}
					throw ParserException("Adding columns with constraints not yet supported");
				}
			}
			auto column_names = TransformNameList(*column_name_list);
			if (column_names.empty()) {
				throw InternalException("Expected a name");
			}
			column_entry.SetName(column_names.back());
			if (column_names.size() == 1) {
				// ADD COLUMN
				result->info = make_uniq<AddColumnInfo>(std::move(data), std::move(column_entry), command->missing_ok);
			} else {
				// ADD FIELD
				column_names.pop_back();
				result->info = make_uniq<AddFieldInfo>(std::move(data), std::move(column_names),
				                                       std::move(column_entry), command->missing_ok);
			}
			break;
		}
		case duckdb_libpgquery::PG_AT_DropColumn: {
			auto cascade = command->behavior == duckdb_libpgquery::PG_DROP_CASCADE;
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Dropping columns is only supported for tables");
			}
			auto column_names = TransformNameList(*command->def_list);
			if (column_names.empty()) {
				throw InternalException("Expected a name");
			}
			if (column_names.size() == 1) {
				result->info =
				    make_uniq<RemoveColumnInfo>(std::move(data), column_names[0], command->missing_ok, cascade);
			} else {
				result->info =
				    make_uniq<RemoveFieldInfo>(std::move(data), std::move(column_names), command->missing_ok, cascade);
			}
			break;
		}
		case duckdb_libpgquery::PG_AT_ColumnDefault: {
			auto expr = TransformExpression(command->def);
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Alter column's default is only supported for tables");
			}
			result->info = make_uniq<SetDefaultInfo>(std::move(data), command->name, std::move(expr));
			break;
		}
		case duckdb_libpgquery::PG_AT_AlterColumnType: {
			auto column_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(command->def);
			auto column_entry = TransformColumnDefinition(*column_def);

			unique_ptr<ParsedExpression> expr;
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Alter column's type is only supported for tables");
			}

			if (column_entry.GetType() == LogicalType::UNKNOWN && !column_def->raw_default) {
				throw ParserException("Omitting the type is only possible in combination with USING");
			}

			if (column_def->raw_default) {
				expr = TransformExpression(column_def->raw_default);
			} else {
				auto col_ref = make_uniq<ColumnRefExpression>(command->name);
				expr = make_uniq<CastExpression>(column_entry.Type(), std::move(col_ref));
			}
			result->info =
			    make_uniq<ChangeColumnTypeInfo>(std::move(data), command->name, column_entry.Type(), std::move(expr));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetNotNull: {
			result->info = make_uniq<SetNotNullInfo>(std::move(data), command->name);
			break;
		}
		case duckdb_libpgquery::PG_AT_DropNotNull: {
			result->info = make_uniq<DropNotNullInfo>(std::move(data), command->name);
			break;
		}
		case duckdb_libpgquery::PG_AT_AddConstraint: {
			auto pg_constraint = PGCast<duckdb_libpgquery::PGConstraint>(*command->def);
			if (pg_constraint.contype != duckdb_libpgquery::PGConstrType::PG_CONSTR_PRIMARY) {
				throw NotImplementedException("No support for that ALTER TABLE option yet!");
			}

			auto constraint = TransformConstraint(pg_constraint);
			result->info = make_uniq<AddConstraintInfo>(std::move(data), std::move(constraint));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetPartitionedBy: {
			vector<unique_ptr<ParsedExpression>> partition_keys;
			if (command->def_list) {
				TransformExpressionList(*command->def_list, partition_keys);
			}
			result->info = make_uniq<SetPartitionedByInfo>(std::move(data), std::move(partition_keys));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetSortedBy: {
			vector<OrderByNode> orders;
			if (command->def_list) {
				TransformOrderBy(command->def_list, orders);
			}
			result->info = make_uniq<SetSortedByInfo>(std::move(data), std::move(orders));
			break;
		}
		default:
			throw NotImplementedException("No support for that ALTER TABLE option yet!");
		}
	}
	return result;
}